

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

int __thiscall ON_XMLVariant::AsInteger(ON_XMLVariant *this)

{
  ON_XMLVariantPrivate *pOVar1;
  int iVar2;
  wchar_t *__nptr;
  long lVar3;
  uint uVar4;
  
  pOVar1 = this->_private;
  switch(pOVar1->_type) {
  case Bool:
    uVar4 = (uint)(pOVar1->field_2)._bool_val;
    break;
  case Integer:
    uVar4 = (pOVar1->field_2)._int_val;
    break;
  case Float:
    uVar4 = (uint)(pOVar1->field_2)._float_val;
    break;
  case Double:
    uVar4 = (uint)(pOVar1->field_2)._double_val;
    break;
  case String:
    iVar2 = ON_wString::CompareNoCase(&pOVar1->_string_val,L"true");
    uVar4 = 1;
    if ((iVar2 != 0) &&
       (iVar2 = ON_wString::CompareNoCase(&this->_private->_string_val,L"t"), iVar2 != 0)) {
      __nptr = ON_wString::operator_cast_to_wchar_t_(&this->_private->_string_val);
      lVar3 = wcstol(__nptr,(wchar_t **)0x0,10);
      uVar4 = (uint)lVar3;
    }
    break;
  default:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

int ON_XMLVariant::AsInteger(void) const
{
  switch (_private->_type)
  {
  case Types::Bool:    return     _private->_bool_val ? 1 : 0;
  case Types::Integer: return     _private->_int_val;
  case Types::Double:  return int(_private->_double_val);
  case Types::Float:   return int(_private->_float_val);

  case Types::String:
    if (_private->_string_val.CompareNoCase(L"true") == 0) return 1;
    if (_private->_string_val.CompareNoCase(L"t") == 0) return true;
    return ON_wtoi(_private->_string_val);

  default:
    return 0;
  }
}